

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ccall.c
# Opt level: O0

void ccall_struct_ret(CCallState *cc,int *rcl,uint8_t *dp,CTSize sz)

{
  uint in_ECX;
  void *in_RDX;
  long in_RSI;
  long in_RDI;
  uint32_t i;
  MSize nfpr;
  MSize ngpr;
  GPRArg sp [2];
  uint local_44;
  uint local_40;
  uint local_3c;
  undefined8 local_38 [7];
  
  local_3c = 0;
  local_40 = 0;
  for (local_44 = 0; local_44 < 2; local_44 = local_44 + 1) {
    if ((*(uint *)(in_RSI + (ulong)local_44 * 4) & 1) == 0) {
      if ((*(uint *)(in_RSI + (ulong)local_44 * 4) & 2) != 0) {
        local_38[local_44] = *(undefined8 *)(in_RDI + 0x10 + (ulong)local_40 * 0x10);
        local_40 = local_40 + 1;
      }
    }
    else {
      local_38[local_44] = *(undefined8 *)(in_RDI + 0x90 + (ulong)local_3c * 8);
      local_3c = local_3c + 1;
    }
  }
  memcpy(in_RDX,local_38,(ulong)in_ECX);
  return;
}

Assistant:

static void ccall_struct_ret(CCallState *cc, int *rcl, uint8_t *dp, CTSize sz)
{
  GPRArg sp[2];
  MSize ngpr = 0, nfpr = 0;
  uint32_t i;
  for (i = 0; i < 2; i++) {
    if ((rcl[i] & CCALL_RCL_INT)) {  /* Integer class takes precedence. */
      sp[i] = cc->gpr[ngpr++];
    } else if ((rcl[i] & CCALL_RCL_SSE)) {
      sp[i] = cc->fpr[nfpr++].l[0];
    }
  }
  memcpy(dp, sp, sz);
}